

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::~dxt_hc(dxt_hc *this)

{
  long lVar1;
  
  vector<crnlib::dxt_hc::alpha_cluster>::~vector(&this->m_alpha_clusters);
  vector<crnlib::dxt_hc::color_cluster>::~vector(&this->m_color_clusters);
  vector<crnlib::dxt_hc::selector_indices_details>::~vector(&this->m_selector_indices);
  vector<crnlib::dxt_hc::endpoint_indices_details>::~vector(&this->m_endpoint_indices);
  vector<unsigned_int>::~vector(&this->m_tile_indices);
  vector<bool>::~vector(&this->m_alpha_selectors_used);
  vector<bool>::~vector(&this->m_color_selectors_used);
  vector<unsigned_long_long>::~vector(&this->m_alpha_selectors);
  vector<unsigned_int>::~vector(&this->m_color_selectors);
  lVar1 = 0x688;
  do {
    vector<unsigned_long_long>::~vector
              ((vector<unsigned_long_long> *)((long)(this->m_color_derating + -1) + 0xc + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0x658);
  vector<unsigned_char>::~vector(&this->m_block_encodings);
  vector<float>::~vector(&this->m_block_weights);
  vector<crnlib::dxt_hc::tile_details>::~vector(&this->m_tiles);
  return;
}

Assistant:

dxt_hc::~dxt_hc() {
}